

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::RuntimeCharSet<char16_t>::Print(RuntimeCharSet<char16_t> *this,DebugWriter *w)

{
  uint uVar1;
  Char c;
  uint i;
  uint k;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  
  DebugWriter::Print(w,L"[");
  uVar2 = 0xffffffff;
  k = 0;
  do {
    c = (Char)k;
    uVar1 = uVar2;
    if (k < 0x100) {
      bVar4 = ((this->direct).vec[k >> 5] >> (k & 0x1f) & 1) != 0;
LAB_00e721ab:
      if (bVar4 == false) goto LAB_00e721bf;
      uVar3 = k;
      if ((int)uVar2 < 0) goto LAB_00e721f7;
    }
    else {
      if (this->root != (CharSetNode *)0x0) {
        bVar4 = Get_helper(this,k);
        goto LAB_00e721ab;
      }
LAB_00e721bf:
      if ((-1 < (int)uVar2) && (uVar1 = 0xffffffff, uVar2 + 1 < k)) {
        if (uVar2 + 2 < k) {
          DebugWriter::Print(w,L"-");
        }
        c = c + L'\xffff';
        uVar3 = 0xffffffff;
LAB_00e721f7:
        DebugWriter::PrintEscapedChar(w,c);
        uVar1 = uVar3;
      }
    }
    uVar2 = uVar1;
    k = k + 1;
    if (k == 0x10000) {
      if (-1 < (int)uVar2) {
        if (uVar2 < 0xfffe) {
          DebugWriter::Print(w,L"-");
        }
        DebugWriter::PrintEscapedChar(w,L'\xffff');
      }
      DebugWriter::Print(w,L"]");
      return;
    }
  } while( true );
}

Assistant:

void RuntimeCharSet<char16>::Print(DebugWriter* w) const
    {
        w->Print(_u("["));
        int start = -1;
        for (uint i = 0; i < NumChars; i++)
        {
            if (Get(UTC(i)))
            {
                if (start < 0)
                {
                    start = i;
                    w->PrintEscapedChar(UTC(i));
                }
            }
            else
            {
                if (start >= 0)
                {
                    if (i > (uint)(start + 1))
                    {
                        if (i  > (uint)(start + 2))
                            w->Print(_u("-"));
                        w->PrintEscapedChar(UTC(i - 1));
                    }
                    start = -1;
                }
            }
        }
        if (start >= 0)
        {
            if ((uint)start < MaxUChar - 1)
                w->Print(_u("-"));
            w->PrintEscapedChar(MaxChar);
        }
        w->Print(_u("]"));
    }